

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::JSONParser::ParseExpectedValue
          (JSONParser *this,ExpectedValue *out_value,AllowExpected allow_expected)

{
  string_view value_str_00;
  string_view value_str_01;
  Result RVar1;
  uint uVar2;
  Enum EVar3;
  int lane;
  uint lane_00;
  Type lane_type;
  Type type;
  string value_str;
  
  value_str._M_dataplus._M_p = (pointer)&value_str.field_2;
  value_str._M_string_length = 0;
  value_str.field_2._M_local_buf[0] = '\0';
  RVar1 = Expect(this,"{");
  EVar3 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = ExpectKey(this,"type");
    if (RVar1.enum_ != Error) {
      RVar1 = ParseType(this,&type);
      if (RVar1.enum_ != Error) {
        RVar1 = Expect(this,",");
        if (RVar1.enum_ != Error) {
          if (type.enum_ == V128) {
            RVar1 = ExpectKey(this,"lane_type");
            if (RVar1.enum_ == Error) goto LAB_001841e1;
            RVar1 = ParseType(this,&lane_type);
            if (RVar1.enum_ == Error) goto LAB_001841e1;
            RVar1 = Expect(this,",");
            if (RVar1.enum_ == Error) goto LAB_001841e1;
            RVar1 = ExpectKey(this,"value");
            if (RVar1.enum_ == Error) goto LAB_001841e1;
            RVar1 = Expect(this,"[");
            if (RVar1.enum_ == Error) goto LAB_001841e1;
            uVar2 = LaneCountFromType(lane_type);
            for (lane_00 = 0; uVar2 != lane_00; lane_00 = lane_00 + 1) {
              RVar1 = ParseString(this,&value_str);
              if (RVar1.enum_ == Error) goto LAB_001841e1;
              value_str_00.size_ = value_str._M_string_length;
              value_str_00.data_ = value_str._M_dataplus._M_p;
              RVar1 = ParseLaneConstValue(this,lane_type,lane_00,out_value,value_str_00,
                                          allow_expected);
              if (RVar1.enum_ == Error) goto LAB_001841e1;
              if (lane_00 < uVar2 - 1) {
                RVar1 = Expect(this,",");
                if (RVar1.enum_ == Error) goto LAB_001841e1;
              }
            }
            RVar1 = Expect(this,"]");
            if (RVar1.enum_ == Error) goto LAB_001841e1;
            (out_value->value).type.enum_ = V128;
            (out_value->lane_type).enum_ = lane_type.enum_;
          }
          else {
            RVar1 = ParseKeyStringValue(this,"value",&value_str);
            if (RVar1.enum_ == Error) goto LAB_001841e1;
            value_str_01.size_ = value_str._M_string_length;
            value_str_01.data_ = value_str._M_dataplus._M_p;
            RVar1 = ParseConstValue(this,type,&(out_value->value).value,out_value->nan,value_str_01,
                                    allow_expected);
            if (RVar1.enum_ == Error) goto LAB_001841e1;
            (out_value->value).type.enum_ = type.enum_;
          }
          RVar1 = Expect(this,"}");
          EVar3 = (Enum)(RVar1.enum_ == Error);
        }
      }
    }
  }
LAB_001841e1:
  std::__cxx11::string::_M_dispose();
  return (Result)EVar3;
}

Assistant:

wabt::Result JSONParser::ParseExpectedValue(ExpectedValue* out_value,
                                            AllowExpected allow_expected) {
  Type type;
  std::string value_str;
  EXPECT("{");
  EXPECT_KEY("type");
  CHECK_RESULT(ParseType(&type));
  EXPECT(",");
  if (type == Type::V128) {
    Type lane_type;
    EXPECT_KEY("lane_type");
    CHECK_RESULT(ParseType(&lane_type));
    EXPECT(",");
    EXPECT_KEY("value");
    EXPECT("[");

    int lane_count = LaneCountFromType(lane_type);
    for (int lane = 0; lane < lane_count; ++lane) {
      CHECK_RESULT(ParseString(&value_str));
      CHECK_RESULT(ParseLaneConstValue(lane_type, lane, out_value, value_str,
                                       allow_expected));
      if (lane < lane_count - 1) {
        EXPECT(",");
      }
    }
    EXPECT("]");
    out_value->value.type = type;
    out_value->lane_type = lane_type;
  } else {
    PARSE_KEY_STRING_VALUE("value", &value_str);
    CHECK_RESULT(ParseConstValue(type, &out_value->value.value,
                                 &out_value->nan[0], value_str,
                                 allow_expected));
    out_value->value.type = type;
  }
  EXPECT("}");

  return wabt::Result::Ok;
}